

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O0

Pipeline *
buildEmptyPipelineModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,TensorAttributes *outTensorAttr)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  FeatureType *pFVar3;
  ArrayFeatureType *pAVar4;
  Pipeline *pPVar5;
  Pipeline *pipeline;
  int i_1;
  ArrayFeatureType *outTensorShape;
  FeatureDescription *outTensor;
  int i;
  ArrayFeatureType *inTensorShape;
  FeatureDescription *inTensor;
  TensorAttributes *outTensorAttr_local;
  TensorAttributes *inTensorAttr_local;
  bool isUpdatable_local;
  Model *m_local;
  
  pMVar1 = CoreML::Specification::Model::mutable_description(m);
  pFVar2 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,inTensorAttr->name);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar4,ArrayFeatureType_ArrayDataType_FLOAT32);
  for (outTensor._4_4_ = 0; outTensor._4_4_ < inTensorAttr->dimension;
      outTensor._4_4_ = outTensor._4_4_ + 1) {
    CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,1);
  }
  pMVar1 = CoreML::Specification::Model::mutable_description(m);
  pFVar2 = CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,outTensorAttr->name);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar4,ArrayFeatureType_ArrayDataType_FLOAT32);
  for (pipeline._4_4_ = 0; pipeline._4_4_ < outTensorAttr->dimension;
      pipeline._4_4_ = pipeline._4_4_ + 1) {
    CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,1);
  }
  CoreML::Specification::Model::set_specificationversion(m,4);
  pPVar5 = CoreML::Specification::Model::mutable_pipeline(m);
  if (isUpdatable) {
    CoreML::Specification::Model::set_isupdatable(m,true);
  }
  return pPVar5;
}

Assistant:

Specification::Pipeline* buildEmptyPipelineModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorAttr->name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < outTensorAttr->dimension; i++) {
        outTensorShape->add_shape(1);
    }
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto pipeline = m.mutable_pipeline();
    
    if (isUpdatable) {
        m.set_isupdatable(true);
    }
    
    return pipeline;
}